

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_partset_reg(TCGContext_conflict2 *tcg_ctx,int opsize,TCGv_i32 reg,TCGv_i32 val)

{
  TCGTemp *ts;
  uintptr_t o;
  uintptr_t o_1;
  
  if (1 < opsize - 2U) {
    if (opsize == 1) {
      tcg_gen_andi_i32_m68k(tcg_ctx,reg,reg,-0x10000);
      ts = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
      tcg_gen_ext16u_i32_m68k(tcg_ctx,(TCGv_i32)((long)ts - (long)tcg_ctx),val);
    }
    else {
      tcg_gen_andi_i32_m68k(tcg_ctx,reg,reg,-0x100);
      ts = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
      tcg_gen_ext8u_i32_m68k(tcg_ctx,(TCGv_i32)((long)ts - (long)tcg_ctx),val);
    }
    tcg_gen_op3_m68k(tcg_ctx,INDEX_op_or_i32,(TCGArg)(reg + (long)tcg_ctx),
                     (TCGArg)(reg + (long)tcg_ctx),(TCGArg)ts);
    tcg_temp_free_internal_m68k(tcg_ctx,ts);
    return;
  }
  if (reg != val) {
    tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(reg + (long)tcg_ctx),
                     (TCGArg)(val + (long)tcg_ctx));
    return;
  }
  return;
}

Assistant:

static void gen_partset_reg(TCGContext *tcg_ctx, int opsize, TCGv reg, TCGv val)
{
    TCGv tmp;
    switch (opsize) {
    case OS_BYTE:
        tcg_gen_andi_i32(tcg_ctx, reg, reg, 0xffffff00);
        tmp = tcg_temp_new(tcg_ctx);
        tcg_gen_ext8u_i32(tcg_ctx, tmp, val);
        tcg_gen_or_i32(tcg_ctx, reg, reg, tmp);
        tcg_temp_free(tcg_ctx, tmp);
        break;
    case OS_WORD:
        tcg_gen_andi_i32(tcg_ctx, reg, reg, 0xffff0000);
        tmp = tcg_temp_new(tcg_ctx);
        tcg_gen_ext16u_i32(tcg_ctx, tmp, val);
        tcg_gen_or_i32(tcg_ctx, reg, reg, tmp);
        tcg_temp_free(tcg_ctx, tmp);
        break;
    case OS_LONG:
    case OS_SINGLE:
        tcg_gen_mov_i32(tcg_ctx, reg, val);
        break;
    default:
        g_assert_not_reached();
    }
}